

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_field.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::cpp::anon_unknown_3::SingularString::GenerateMessageClearingCode
          (SingularString *this,Printer *p)

{
  char cVar1;
  char *pcVar2;
  undefined8 uStack_100;
  allocator<char> local_f1;
  char *local_f0;
  string local_e8;
  Sub local_c8;
  
  if ((this->super_FieldGeneratorBase).is_oneof_ == true) {
    pcVar2 = "\n      $field_$.Destroy();\n    ";
    uStack_100 = 0x1f;
  }
  else {
    if ((this->super_FieldGeneratorBase).is_inlined_ == true) {
      cVar1 = google::protobuf::internal::cpp::HasHasbit((this->super_FieldGeneratorBase).field_);
      if (cVar1 != '\0') {
        io::Printer::Emit(p,0x2a,"\n      $DCHK$(!$field_$.IsDefault());\n    ");
      }
    }
    if (*(long *)(*(long *)((this->super_FieldGeneratorBase).field_ + 0x50) + 8) == 0) {
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_e8,"Clear",&local_f1);
      cVar1 = google::protobuf::internal::cpp::HasHasbit((this->super_FieldGeneratorBase).field_);
      local_f0 = "ClearToEmpty";
      if (cVar1 != '\0') {
        local_f0 = "ClearNonDefaultToEmpty";
      }
      io::Printer::Sub::Sub<char_const*>(&local_c8,&local_e8,&local_f0);
      google::protobuf::io::Printer::Emit
                (p,&local_c8,1,0x2b,"\n            $field_$.$Clear$();\n          ");
      io::Printer::Sub::~Sub(&local_c8);
      std::__cxx11::string::~string((string *)&local_e8);
      return;
    }
    pcVar2 = "\n      $field_$.ClearToDefault($lazy_var$, GetArena());\n    ";
    uStack_100 = 0x3c;
  }
  io::Printer::Emit(p,uStack_100,pcVar2);
  return;
}

Assistant:

void SingularString::GenerateMessageClearingCode(io::Printer* p) const {
  if (is_oneof()) {
    p->Emit(R"cc(
      $field_$.Destroy();
    )cc");
    return;
  }

  // Two-dimension specialization here: supporting arenas, field presence, or
  // not, and default value is the empty string or not. Complexity here ensures
  // the minimal number of branches / amount of extraneous code at runtime
  // (given that the below methods are inlined one-liners)!

  // If we have a hasbit, then the Clear() method of the protocol buffer
  // will have checked that this field is set.  If so, we can avoid redundant
  // checks against the default variable.

  if (is_inlined() && HasHasbit(field_)) {
    // Calling mutable_$name$() gives us a string reference and sets the has bit
    // for $name$ (in proto2).  We may get here when the string field is inlined
    // but the string's contents have not been changed by the user, so we cannot
    // make an assertion about the contents of the string and could never make
    // an assertion about the string instance.
    //
    // For non-inlined strings, we distinguish from non-default by comparing
    // instances, rather than contents.
    p->Emit(R"cc(
      $DCHK$(!$field_$.IsDefault());
    )cc");
  }

  if (!EmptyDefault()) {
    // Clear to a non-empty default is more involved, as we try to use the
    // Arena if one is present and may need to reallocate the string.
    p->Emit(R"cc(
      $field_$.ClearToDefault($lazy_var$, GetArena());
    )cc");
    return;
  }

  p->Emit({{"Clear",
            HasHasbit(field_) ? "ClearNonDefaultToEmpty" : "ClearToEmpty"}},
          R"cc(
            $field_$.$Clear$();
          )cc");
}